

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

long dist(Point p,Point q)

{
  undefined8 local_38;
  long dy;
  long dx;
  Point q_local;
  Point p_local;
  
  dy = p.x - q.x;
  if (dy < 0) {
    dy = -dy;
  }
  local_38 = p.y - q.y;
  if (local_38 < 0) {
    local_38 = -local_38;
  }
  return dy + local_38;
}

Assistant:

long  dist(
  Point  p,
  Point  q
)
{
  long  dx, dy;
    
  dx = (p.x) - (q.x);
  if( dx < 0 )  dx = -dx;
  dy = (p.y) - (q.y);
  if( dy < 0 )  dy = -dy;

  return  dx + dy; 
}